

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O2

QCborValue *
QCborContainerPrivate::findCborMapKey<long_long>
          (QCborValue *__return_storage_ptr__,QCborValue *self,longlong key)

{
  QCborValueConstRef QVar1;
  
  if ((self->t == Map) && (self->container != (QCborContainerPrivate *)0x0)) {
    QVar1 = findCborMapKey<long_long>(self->container,key);
    if (QVar1.i < (self->container->elements).d.size) {
      valueAt(__return_storage_ptr__,self->container,QVar1.i);
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
  __return_storage_ptr__->t = Undefined;
  return __return_storage_ptr__;
}

Assistant:

static QCborValue findCborMapKey(const QCborValue &self, KeyType key)
    {
        if (self.isMap() && self.container) {
            qsizetype idx = self.container->findCborMapKey(key).i;
            if (idx < self.container->elements.size())
                return self.container->valueAt(idx);
        }
        return QCborValue();
    }